

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::iterate(CreateContextExtCase *this)

{
  pointer ppvVar1;
  pointer ppvVar2;
  EGLConfig config;
  EGLDisplay pvVar3;
  TestLog *log;
  NativeDisplay *pNVar4;
  CreateContextExtCase *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint uVar7;
  EGLint EVar8;
  Visibility VVar9;
  int iVar10;
  deUint32 err;
  size_t sVar11;
  ostream *poVar12;
  eglu *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  undefined8 uVar14;
  Library *egl;
  NativePixmapFactory *pNVar15;
  NativeWindow *window;
  EGLSurface pvVar16;
  long *plVar17;
  NativeWindowFactory *pNVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_01;
  TestError *this_02;
  _Rb_tree_node_base *p_Var19;
  qpTestLog *pqVar20;
  FILE *pFVar21;
  char **ppcVar22;
  EGLint mask;
  EGLint flags;
  bool bVar23;
  IterateResult IVar24;
  char *pcVar25;
  int *piVar26;
  qpTestResult testResult;
  TestContext *this_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  ScopedLogSection section;
  UniqueSurface surface;
  ostringstream attribListString;
  allocator<char> local_3f9;
  CreateContextExtCase *local_3f8;
  qpTestLog *local_3f0;
  long local_3e8;
  undefined1 local_3e0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  pointer local_3c0;
  char *pcStack_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  char *local_3a0;
  char *local_398;
  char *pcStack_390;
  undefined1 local_388 [8];
  qpTestLog *local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [6];
  ios_base local_318 [8];
  ios_base local_310 [264];
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [12];
  undefined4 uStack_19c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Rb_tree_node_base *local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  iVar10 = this->m_iteration;
  if (iVar10 == 0) {
    piVar26 = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_3f8 = this;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    do {
      iVar10 = *piVar26;
LAB_00e2f613:
      do {
        if (0x30fa < iVar10) {
          if (iVar10 < 0x30fd) {
            if (iVar10 == 0x30fb) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"EGL_CONTEXT_MINOR_VERSION_KHR, ",0x1f);
              poVar12 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,piVar26[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
              goto LAB_00e2f859;
            }
            if (iVar10 != 0x30fc) goto LAB_00e2f613;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"EGL_CONTEXT_FLAGS_KHR, ",0x17);
            egl::(anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
                      ((string *)local_388,(_anonymous_namespace_ *)(ulong)(uint)piVar26[1],flags);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_388,(long)local_380);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
          }
          else {
            if (iVar10 != 0x30fd) {
              if (iVar10 == 0x31bd) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_KHR, ",0x34);
                pcVar25 = "<Unknown>";
                if (piVar26[1] == 0x31bf) {
                  pcVar25 = "EGL_LOSE_CONTEXT_ON_RESET_KHR";
                }
                if (piVar26[1] == 0x31be) {
                  pcVar25 = "EGL_NO_RESET_NOTIFICATION_KHR";
                }
                sVar11 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar25,sVar11);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                goto LAB_00e2f859;
              }
              goto LAB_00e2f613;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR, ",0x25);
            egl::(anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                      ((string *)local_388,(_anonymous_namespace_ *)(ulong)(uint)piVar26[1],mask);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_388,(long)local_380);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
          }
          if (local_388 != (undefined1  [8])local_378) {
            operator_delete((void *)local_388,(ulong)(local_378[0]._M_allocated_capacity + 1));
          }
          goto LAB_00e2f859;
        }
        if (iVar10 == 0x3038) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"EGL_NONE",8);
          pCVar5 = local_3f8;
          local_388 = (undefined1  [8])
                      ((local_3f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_380);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_380,"EGL attrib list: { ",0x13);
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_380,(char *)local_3e0._16_8_,(long)local_3c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_380," }",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((FILE *)local_3e0._16_8_ != (FILE *)&local_3c0) {
            operator_delete((void *)local_3e0._16_8_,(long)local_3c0 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_380);
          std::ios_base::~ios_base(local_310);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_1a8._8_4_ = _S_red;
          local_198._M_allocated_capacity = 0;
          p_Var19 = (_Rb_tree_node_base *)(local_1a8 + 8);
          local_180 = 0;
          local_198._8_8_ = p_Var19;
          local_188 = p_Var19;
          this_00 = (eglu *)EglTestContext::getLibrary((pCVar5->super_TestCase).m_eglTestCtx);
          eglu::getDisplayExtensions_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_3e0 + 0x10),this_00,(Library *)pCVar5->m_display,p_Var19);
          piVar26 = (pCVar5->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_00e2f9bb;
        }
        if (iVar10 == 0x3098) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "EGL_CONTEXT_MAJOR_VERSION_KHR(EGL_CONTEXT_CLIENT_VERSION), ",0x3b);
          poVar12 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,piVar26[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
          goto LAB_00e2f859;
        }
      } while (iVar10 != 0x30bf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ",0x26);
      uVar7 = piVar26[1];
      if (uVar7 < 2) {
        pcVar25 = "status == EGL_TRUE";
        if (uVar7 == 0) {
          pcVar25 = "status == EGL_FALSE";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar25 + 10,(ulong)(uVar7 == 0) | 8);
      }
      else {
        std::ostream::operator<<((ostringstream *)local_1a8,uVar7);
      }
LAB_00e2f859:
      piVar26 = piVar26 + 2;
    } while( true );
  }
  goto LAB_00e2fdd8;
LAB_00e2f9bb:
  iVar10 = *piVar26;
  if (iVar10 < 0x30fc) {
    if (iVar10 < 0x30bf) {
      if (iVar10 == 0x3098) goto LAB_00e2fcb1;
      if (iVar10 == 0x3038) goto LAB_00e2fcba;
      goto LAB_00e2f9bb;
    }
    if (iVar10 != 0x30bf) {
      if (iVar10 == 0x30fb) {
        local_3f0 = (qpTestLog *)&DAT_00000016;
        local_388 = (undefined1  [8])local_378;
        local_388 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f0);
        local_378[0]._M_allocated_capacity = local_3f0;
        *(undefined8 *)local_388 = 0x5f52484b5f4c4745;
        ((TestLog *)((long)local_388 + 8))->m_log = (qpTestLog *)0x635f657461657263;
        builtin_strncpy((char *)((long)&((TestLog *)((long)local_388 + 8))->m_log + 6),"_context",8)
        ;
        local_380 = local_3f0;
        *(char *)((long)local_388 + (long)local_3f0) = '\0';
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
        goto LAB_00e2fc94;
      }
      goto LAB_00e2f9bb;
    }
    local_3f0 = (qpTestLog *)0x21;
    local_388 = (undefined1  [8])local_378;
    local_388 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f0);
    local_378[0]._M_allocated_capacity = local_3f0;
    ((TestLog *)((long)local_388 + 0x10))->m_log = (qpTestLog *)0x725f747865746e6f;
    ((TestLog *)((long)local_388 + 0x18))->m_log = (qpTestLog *)0x73656e747375626f;
    *(undefined8 *)local_388 = 0x5f5458455f4c4745;
    ((TestLog *)((long)local_388 + 8))->m_log = (qpTestLog *)0x635f657461657263;
    *(char *)&((TestLog *)((long)local_388 + 0x20))->m_log = 's';
    local_380 = local_3f0;
    *(char *)((long)local_388 + (long)local_3f0) = '\0';
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_1a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
  }
  else if (iVar10 < 0x3138) {
    if (iVar10 == 0x30fc) {
      local_3f0 = (qpTestLog *)&DAT_00000016;
      local_388 = (undefined1  [8])local_378;
      local_388 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f0);
      local_378[0]._M_allocated_capacity = local_3f0;
      *(undefined8 *)local_388 = 0x5f52484b5f4c4745;
      ((TestLog *)((long)local_388 + 8))->m_log = (qpTestLog *)0x635f657461657263;
      builtin_strncpy((char *)((long)&((TestLog *)((long)local_388 + 8))->m_log + 6),"_context",8);
      local_380 = local_3f0;
      *(char *)((long)local_388 + (long)local_3f0) = '\0';
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
    }
    else {
      if (iVar10 != 0x30fd) goto LAB_00e2f9bb;
      local_3f0 = (qpTestLog *)&DAT_00000016;
      local_388 = (undefined1  [8])local_378;
      local_388 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f0);
      local_378[0]._M_allocated_capacity = local_3f0;
      *(undefined8 *)local_388 = 0x5f52484b5f4c4745;
      ((TestLog *)((long)local_388 + 8))->m_log = (qpTestLog *)0x635f657461657263;
      builtin_strncpy((char *)((long)&((TestLog *)((long)local_388 + 8))->m_log + 6),"_context",8);
      local_380 = local_3f0;
      *(char *)((long)local_388 + (long)local_3f0) = '\0';
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
    }
  }
  else if (iVar10 == 0x3138) {
    local_3f0 = (qpTestLog *)0x21;
    local_388 = (undefined1  [8])local_378;
    local_388 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f0);
    local_378[0]._M_allocated_capacity = local_3f0;
    ((TestLog *)((long)local_388 + 0x10))->m_log = (qpTestLog *)0x725f747865746e6f;
    ((TestLog *)((long)local_388 + 0x18))->m_log = (qpTestLog *)0x73656e747375626f;
    *(undefined8 *)local_388 = 0x5f5458455f4c4745;
    ((TestLog *)((long)local_388 + 8))->m_log = (qpTestLog *)0x635f657461657263;
    *(char *)&((TestLog *)((long)local_388 + 0x20))->m_log = 's';
    local_380 = local_3f0;
    *(char *)((long)local_388 + (long)local_3f0) = '\0';
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_1a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
  }
  else {
    if (iVar10 != 0x31bd) goto LAB_00e2f9bb;
    local_3f0 = (qpTestLog *)&DAT_00000016;
    local_388 = (undefined1  [8])local_378;
    local_388 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f0);
    local_378[0]._M_allocated_capacity = local_3f0;
    *(undefined8 *)local_388 = 0x5f52484b5f4c4745;
    ((TestLog *)((long)local_388 + 8))->m_log = (qpTestLog *)0x635f657461657263;
    builtin_strncpy((char *)((long)&((TestLog *)((long)local_388 + 8))->m_log + 6),"_context",8);
    local_380 = local_3f0;
    *(char *)((long)local_388 + (long)local_3f0) = '\0';
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_1a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
  }
LAB_00e2fc94:
  if (local_388 != (undefined1  [8])local_378) {
    operator_delete((void *)local_388,(ulong)(local_378[0]._M_allocated_capacity + 1));
  }
LAB_00e2fcb1:
  piVar26 = piVar26 + 2;
  goto LAB_00e2f9bb;
LAB_00e2fcba:
  p_Var19 = (_Rb_tree_node_base *)(local_1a8 + 8);
  if ((_Rb_tree_node_base *)local_198._8_8_ != p_Var19) {
    bVar23 = true;
    uVar14 = local_198._8_8_;
    do {
      while (pbVar6 = local_3c8,
            _Var13 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               (local_3e0._16_8_,local_3c8,(_Rb_tree_node_base *)(uVar14 + 0x20)),
            _Var13._M_current == pbVar6) {
        local_388 = (undefined1  [8])
                    ((local_3f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_380);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_380,"Required extension \'",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_380,*(char **)(uVar14 + 0x20),
                   (long)((_Rb_tree_node_base *)(uVar14 + 0x20))->_M_parent);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_380,"\' not supported",0xf);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_380);
        std::ios_base::~ios_base(local_310);
        uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14);
        bVar23 = false;
        if ((_Rb_tree_node_base *)uVar14 == p_Var19) {
LAB_00e30424:
          this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_01,"Required extensions not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                     ,0x1b6);
          __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
      }
      uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14);
    } while ((_Rb_tree_node_base *)uVar14 != p_Var19);
    if (bVar23) goto LAB_00e2fdb9;
    goto LAB_00e30424;
  }
LAB_00e2fdb9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_3e0 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
  iVar10 = local_3f8->m_iteration;
  this = local_3f8;
LAB_00e2fdd8:
  ppvVar1 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar2 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (iVar10 < (int)((ulong)((long)ppvVar2 - (long)ppvVar1) >> 3)) {
    egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    config = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_iteration];
    uVar7 = eglu::getConfigAttribInt(egl,this->m_display,config,0x3033);
    EVar8 = eglu::getConfigAttribInt(egl,this->m_display,config,0x3028);
    if ((uVar7 & 1) == 0) {
      if ((uVar7 & 4) == 0) {
        if ((uVar7 & 2) == 0) {
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,"Invalid or empty surface type bits",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                     ,0x39e);
          __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pNVar15 = eglu::selectNativePixmapFactory
                            (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                             m_cmdLine);
        window = (NativeWindow *)
                 (**(code **)(*(long *)pNVar15 + 0x20))
                           (pNVar15,(((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                                    super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                    .m_data.ptr,this->m_display,config,0,0x100,0x100);
        pvVar3 = this->m_display;
        pvVar16 = eglu::createPixmapSurface
                            ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,(NativePixmap *)window,pvVar3,config,(EGLAttrib *)0x0);
        eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_388,egl,pvVar3,pvVar16);
        executeForSurface(this,config,(EGLSurface)local_378[0]._0_8_);
      }
      else {
        pNVar18 = eglu::selectNativeWindowFactory
                            (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                             m_cmdLine);
        pvVar3 = this->m_display;
        pNVar4 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                 super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
                 m_data.ptr;
        VVar9 = eglu::parseWindowVisibility
                          (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                           m_cmdLine);
        local_388 = (undefined1  [8])0x10000000100;
        local_380 = (qpTestLog *)CONCAT44(local_380._4_4_,VVar9);
        iVar10 = (*(pNVar18->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                           (pNVar18,pNVar4,pvVar3,config);
        window = (NativeWindow *)CONCAT44(extraout_var,iVar10);
        pvVar3 = this->m_display;
        pvVar16 = eglu::createWindowSurface
                            ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,window,pvVar3,config,(EGLAttrib *)0x0);
        eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_388,egl,pvVar3,pvVar16);
        executeForSurface(this,config,(EGLSurface)local_378[0]._0_8_);
      }
      eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_388);
      (*window->_vptr_NativeWindow[1])(window);
    }
    else {
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_3f8 = this;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
      std::ostream::operator<<((ostringstream *)local_388,EVar8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
      std::ios_base::~ios_base(local_318);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x1b9b744);
      pqVar20 = (qpTestLog *)(plVar17 + 2);
      if ((qpTestLog *)*plVar17 == pqVar20) {
        local_3e0._0_8_ = *(undefined8 *)pqVar20;
        local_3e0._8_8_ = plVar17[3];
        local_3f0 = (qpTestLog *)local_3e0;
      }
      else {
        local_3e0._0_8_ = *(undefined8 *)pqVar20;
        local_3f0 = (qpTestLog *)*plVar17;
      }
      local_3e8 = plVar17[1];
      *plVar17 = (long)pqVar20;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_3f0);
      pFVar21 = (FILE *)(plVar17 + 2);
      if ((FILE *)*plVar17 == pFVar21) {
        local_3c0 = *(pointer *)&pFVar21->_flags;
        pcStack_3b8 = (char *)plVar17[3];
        local_3e0._16_8_ = (FILE *)&local_3c0;
      }
      else {
        local_3c0 = *(pointer *)&pFVar21->_flags;
        local_3e0._16_8_ = (FILE *)*plVar17;
      }
      local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar17[1];
      *plVar17 = (long)pFVar21;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,(char *)local_3e0._16_8_,&local_3f9);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
      std::ostream::operator<<(local_388,EVar8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
      std::ios_base::~ios_base(local_318);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x1b9b744);
      ppcVar22 = (char **)(plVar17 + 2);
      if ((char **)*plVar17 == ppcVar22) {
        local_398 = *ppcVar22;
        pcStack_390 = (char *)plVar17[3];
        local_3b0._8_8_ = &local_398;
      }
      else {
        local_398 = *ppcVar22;
        local_3b0._8_8_ = (char **)*plVar17;
      }
      local_3a0 = (char *)plVar17[1];
      *plVar17 = (long)ppcVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,(char *)local_3b0._8_8_,(allocator<char> *)local_388);
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_3b0._M_allocated_capacity,log,(string *)local_1a8,
                 &local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((char **)local_3b0._8_8_ != &local_398) {
        operator_delete((void *)local_3b0._8_8_,(ulong)(local_398 + 1));
      }
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != &local_198) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                        (ulong)(local_198._M_allocated_capacity + 1));
      }
      if ((FILE *)local_3e0._16_8_ != (FILE *)&local_3c0) {
        operator_delete((void *)local_3e0._16_8_,(ulong)((long)&(local_3c0->_M_dataplus)._M_p + 1));
      }
      this = local_3f8;
      if (local_3f0 != (qpTestLog *)local_3e0) {
        operator_delete(local_3f0,local_3e0._0_8_ + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      local_1a8._0_4_ = 0x3057;
      local_1a8._4_4_ = 0x40;
      local_1a8._8_4_ = 0x3056;
      uStack_19c = 0x40;
      local_198._M_allocated_capacity._0_4_ = 0x3038;
      pvVar3 = this->m_display;
      iVar10 = (*egl->_vptr_Library[10])(egl,pvVar3,config);
      eglu::UniqueSurface::UniqueSurface
                ((UniqueSurface *)local_388,egl,pvVar3,(EGLSurface)CONCAT44(extraout_var_00,iVar10))
      ;
      err = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(err,"eglCreatePbufferSurface",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                       ,0x387);
      executeForSurface(this,config,(EGLSurface)local_378[0]._0_8_);
      eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_388);
      tcu::TestLog::endSection((TestLog *)local_3b0._M_allocated_capacity);
    }
    this->m_iteration = this->m_iteration + 1;
    IVar24 = CONTINUE;
  }
  else {
    if (ppvVar2 == ppvVar1) {
      local_388 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_380);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_380,"No supported configs found",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_380);
      std::ios_base::~ios_base(local_310);
      this_03 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar25 = "No supported configs found";
      testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    }
    else {
      this_03 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (this->m_isOk == true) {
        tcu::TestContext::setTestResult(this_03,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      pcVar25 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(this_03,testResult,pcVar25);
    IVar24 = STOP;
  }
  return IVar24;
}

Assistant:

TestCase::IterateResult CreateContextExtCase::iterate (void)
{
	if (m_iteration == 0)
	{
		logAttribList();
		checkRequiredExtensions();
	}

	if (m_iteration < (int)m_configs.size())
	{
		const Library&		egl				= m_eglTestCtx.getLibrary();
		const EGLConfig		config			= m_configs[m_iteration];
		const EGLint		surfaceTypes	= eglu::getConfigAttribInt(egl, m_display, config, EGL_SURFACE_TYPE);
		const EGLint		configId		= eglu::getConfigAttribInt(egl, m_display, config, EGL_CONFIG_ID);

		if ((surfaceTypes & EGL_PBUFFER_BIT) != 0)
		{
			tcu::ScopedLogSection	section			(m_testCtx.getLog(), ("EGLConfig ID: " + de::toString(configId) + " with PBuffer").c_str(), ("EGLConfig ID: " + de::toString(configId)).c_str());
			const EGLint			attribList[]	=
			{
				EGL_WIDTH,	64,
				EGL_HEIGHT,	64,
				EGL_NONE
			};
			eglu::UniqueSurface		surface			(egl, m_display, egl.createPbufferSurface(m_display, config, attribList));
			EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface");

			executeForSurface(config, *surface);
		}
		else if ((surfaceTypes & EGL_WINDOW_BIT) != 0)
		{
			const eglu::NativeWindowFactory&	factory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

			de::UniquePtr<eglu::NativeWindow>	window	(factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, config, DE_NULL, eglu::WindowParams(256, 256, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
			eglu::UniqueSurface					surface	(egl, m_display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, m_display, config, DE_NULL));

			executeForSurface(config, *surface);
		}
		else if ((surfaceTypes & EGL_PIXMAP_BIT) != 0)
		{
			const eglu::NativePixmapFactory&	factory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

			de::UniquePtr<eglu::NativePixmap>	pixmap	(factory.createPixmap(&m_eglTestCtx.getNativeDisplay(), m_display, config, DE_NULL, 256, 256));
			eglu::UniqueSurface					surface	(egl, m_display, eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, m_display, config, DE_NULL));

			executeForSurface(config, *surface);
		}
		else // No supported surface type
			TCU_FAIL("Invalid or empty surface type bits");

		m_iteration++;
		return CONTINUE;
	}
	else
	{
		if (m_configs.size() == 0)
		{
			m_testCtx.getLog() << TestLog::Message << "No supported configs found" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "No supported configs found");
		}
		else if (m_isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}
}